

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void __thiscall VmFunction::UpdateDominatorTree(VmFunction *this,VmModule *module,bool clear)

{
  VmBlock *pVVar1;
  bool bVar2;
  bool bVar3;
  VmBlock *pVVar4;
  uint uVar5;
  uint uVar6;
  VmValue **ppVVar7;
  VmBlock **ppVVar8;
  VmBlock *local_1e8;
  VmBlock *curr_3;
  uint k_2;
  bool found;
  VmBlock *runner;
  VmBlock *p_1;
  VmBlock *pVStack_1c0;
  uint i_3;
  VmBlock *curr_2;
  VmBlock *p;
  VmBlock *pVStack_1a8;
  uint k_1;
  VmBlock *newIdom;
  VmBlock *pVStack_198;
  uint k;
  VmBlock *firstProcessed;
  VmBlock *b;
  uint i_2;
  bool changed;
  VmBlock *tmp;
  uint i_1;
  uint local_168 [2];
  uint postOrder;
  uint preOrder;
  SmallArray<VmBlock_*,_32U> blocksPostOrder;
  VmInstruction *inst;
  VmValue *user;
  VmBlock *pVStack_30;
  uint i;
  VmBlock *curr_1;
  VmBlock *curr;
  VmModule *pVStack_18;
  bool clear_local;
  VmModule *module_local;
  VmFunction *this_local;
  
  if (this->firstBlock != (VmBlock *)0x0) {
    curr._7_1_ = clear;
    pVStack_18 = module;
    module_local = (VmModule *)this;
    for (curr_1 = this->firstBlock; curr_1 != (VmBlock *)0x0; curr_1 = curr_1->nextSibling) {
      if ((curr._7_1_ & 1) != 0) {
        SmallArray<VmBlock_*,_4U>::clear(&curr_1->predecessors);
        SmallArray<VmBlock_*,_4U>::clear(&curr_1->successors);
      }
      curr_1->visited = false;
      curr_1->idom = (VmBlock *)0x0;
      SmallArray<VmBlock_*,_4U>::clear(&curr_1->dominanceFrontier);
      SmallArray<VmBlock_*,_4U>::clear(&curr_1->dominanceChildren);
    }
    for (pVStack_30 = this->firstBlock; pVStack_30 != (VmBlock *)0x0;
        pVStack_30 = pVStack_30->nextSibling) {
      for (user._4_4_ = 0;
          uVar5 = SmallArray<VmValue_*,_8U>::size(&(pVStack_30->super_VmValue).users),
          user._4_4_ < uVar5; user._4_4_ = user._4_4_ + 1) {
        ppVVar7 = SmallArray<VmValue_*,_8U>::operator[]
                            (&(pVStack_30->super_VmValue).users,user._4_4_);
        blocksPostOrder.allocator = (Allocator *)getType<VmInstruction>(*ppVVar7);
        if (((VmInstruction *)blocksPostOrder.allocator != (VmInstruction *)0x0) &&
           (((VmInstruction *)blocksPostOrder.allocator)->cmd != VM_INST_PHI)) {
          SmallArray<VmBlock_*,_4U>::push_back
                    (&pVStack_30->predecessors,&((VmInstruction *)blocksPostOrder.allocator)->parent
                    );
          SmallArray<VmBlock_*,_4U>::push_back
                    ((SmallArray<VmBlock_*,_4U> *)
                     (blocksPostOrder.allocator[0x1b]._vptr_Allocator + 0x24),
                     &stack0xffffffffffffffd0);
        }
      }
    }
    this->firstBlock->idom = this->firstBlock;
    SmallArray<VmBlock_*,_32U>::SmallArray
              ((SmallArray<VmBlock_*,_32U> *)&postOrder,pVStack_18->allocator);
    local_168[1] = 0;
    local_168[0] = 0;
    anon_unknown.dwarf_c91b1::GetAndNumberControlGraphNodesDfs
              ((SmallArray<VmBlock_*,_32U> *)&postOrder,this->firstBlock,local_168 + 1,local_168);
    for (tmp._0_4_ = 0; uVar5 = (uint)tmp,
        uVar6 = SmallArray<VmBlock_*,_32U>::size((SmallArray<VmBlock_*,_32U> *)&postOrder),
        uVar5 < uVar6 >> 1; tmp._0_4_ = (uint)tmp + 1) {
      ppVVar8 = SmallArray<VmBlock_*,_32U>::operator[]
                          ((SmallArray<VmBlock_*,_32U> *)&postOrder,(uint)tmp);
      _i_2 = *ppVVar8;
      uVar5 = SmallArray<VmBlock_*,_32U>::size((SmallArray<VmBlock_*,_32U> *)&postOrder);
      ppVVar8 = SmallArray<VmBlock_*,_32U>::operator[]
                          ((SmallArray<VmBlock_*,_32U> *)&postOrder,~(uint)tmp + uVar5);
      pVVar1 = *ppVVar8;
      ppVVar8 = SmallArray<VmBlock_*,_32U>::operator[]
                          ((SmallArray<VmBlock_*,_32U> *)&postOrder,(uint)tmp);
      pVVar4 = _i_2;
      *ppVVar8 = pVVar1;
      uVar5 = SmallArray<VmBlock_*,_32U>::size((SmallArray<VmBlock_*,_32U> *)&postOrder);
      ppVVar8 = SmallArray<VmBlock_*,_32U>::operator[]
                          ((SmallArray<VmBlock_*,_32U> *)&postOrder,~(uint)tmp + uVar5);
      *ppVVar8 = pVVar4;
    }
    b._7_1_ = 1;
    while ((b._7_1_ & 1) != 0) {
      b._7_1_ = 0;
      for (b._0_4_ = 0; uVar5 = (uint)b,
          uVar6 = SmallArray<VmBlock_*,_32U>::size((SmallArray<VmBlock_*,_32U> *)&postOrder),
          uVar5 < uVar6; b._0_4_ = (uint)b + 1) {
        ppVVar8 = SmallArray<VmBlock_*,_32U>::operator[]
                            ((SmallArray<VmBlock_*,_32U> *)&postOrder,(uint)b);
        firstProcessed = *ppVVar8;
        if (firstProcessed != this->firstBlock) {
          pVStack_198 = (VmBlock *)0x0;
          for (newIdom._4_4_ = 0; uVar5 = newIdom._4_4_,
              uVar6 = SmallArray<VmBlock_*,_4U>::size(&firstProcessed->predecessors),
              uVar5 < uVar6 && pVStack_198 == (VmBlock *)0x0; newIdom._4_4_ = newIdom._4_4_ + 1) {
            ppVVar8 = SmallArray<VmBlock_*,_4U>::operator[]
                                (&firstProcessed->predecessors,newIdom._4_4_);
            if ((*ppVVar8)->idom != (VmBlock *)0x0) {
              ppVVar8 = SmallArray<VmBlock_*,_4U>::operator[]
                                  (&firstProcessed->predecessors,newIdom._4_4_);
              pVStack_198 = *ppVVar8;
            }
          }
          if (pVStack_198 == (VmBlock *)0x0) {
            __assert_fail("firstProcessed",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x8cc,"void VmFunction::UpdateDominatorTree(VmModule *, bool)");
          }
          pVStack_1a8 = pVStack_198;
          for (p._4_4_ = 0; uVar5 = p._4_4_,
              uVar6 = SmallArray<VmBlock_*,_4U>::size(&firstProcessed->predecessors), uVar5 < uVar6;
              p._4_4_ = p._4_4_ + 1) {
            ppVVar8 = SmallArray<VmBlock_*,_4U>::operator[](&firstProcessed->predecessors,p._4_4_);
            curr_2 = *ppVVar8;
            if ((curr_2 != pVStack_198) && (curr_2->idom != (VmBlock *)0x0)) {
              pVStack_1a8 = anon_unknown.dwarf_c91b1::BlockIdomIntersect(curr_2,pVStack_1a8);
            }
          }
          if (firstProcessed->idom != pVStack_1a8) {
            firstProcessed->idom = pVStack_1a8;
            b._7_1_ = 1;
          }
        }
      }
    }
    this->firstBlock->idom = (VmBlock *)0x0;
    for (pVStack_1c0 = this->firstBlock; pVStack_1c0 != (VmBlock *)0x0;
        pVStack_1c0 = pVStack_1c0->nextSibling) {
      if ((pVStack_1c0->visited & 1U) != 0) {
        uVar5 = SmallArray<VmBlock_*,_4U>::size(&pVStack_1c0->predecessors);
        if (1 < uVar5) {
          for (p_1._4_4_ = 0; uVar5 = SmallArray<VmBlock_*,_4U>::size(&pVStack_1c0->predecessors),
              p_1._4_4_ < uVar5; p_1._4_4_ = p_1._4_4_ + 1) {
            ppVVar8 = SmallArray<VmBlock_*,_4U>::operator[](&pVStack_1c0->predecessors,p_1._4_4_);
            _k_2 = *ppVVar8;
            if ((_k_2->visited & 1U) != 0) {
              for (; _k_2 != pVStack_1c0->idom; _k_2 = _k_2->idom) {
                bVar3 = false;
                curr_3._0_4_ = 0;
                while( true ) {
                  uVar5 = SmallArray<VmBlock_*,_4U>::size(&_k_2->dominanceFrontier);
                  bVar2 = false;
                  if ((uint)curr_3 < uVar5) {
                    bVar2 = (bool)(bVar3 ^ 1);
                  }
                  if (!bVar2) break;
                  ppVVar8 = SmallArray<VmBlock_*,_4U>::operator[]
                                      (&_k_2->dominanceFrontier,(uint)curr_3);
                  if (*ppVVar8 == pVStack_1c0) {
                    bVar3 = true;
                  }
                  curr_3._0_4_ = (uint)curr_3 + 1;
                }
                if (!bVar3) {
                  SmallArray<VmBlock_*,_4U>::push_back
                            (&_k_2->dominanceFrontier,&stack0xfffffffffffffe40);
                }
              }
            }
          }
        }
        if (pVStack_1c0->idom != (VmBlock *)0x0) {
          SmallArray<VmBlock_*,_4U>::push_back
                    (&pVStack_1c0->idom->dominanceChildren,&stack0xfffffffffffffe40);
        }
      }
    }
    for (local_1e8 = this->firstBlock; local_1e8 != (VmBlock *)0x0;
        local_1e8 = local_1e8->nextSibling) {
      local_1e8->visited = false;
    }
    local_168[1] = 0;
    local_168[0] = 0;
    anon_unknown.dwarf_c91b1::NumberDominanceGraphNodesDfs(this->firstBlock,local_168 + 1,local_168)
    ;
    SmallArray<VmBlock_*,_32U>::~SmallArray((SmallArray<VmBlock_*,_32U> *)&postOrder);
  }
  return;
}

Assistant:

void VmFunction::UpdateDominatorTree(VmModule *module, bool clear)
{
	if(!firstBlock)
		return;

	for(VmBlock *curr = firstBlock; curr; curr = curr->nextSibling)
	{
		if(clear)
		{
			curr->predecessors.clear();
			curr->successors.clear();
		}

		curr->visited = false;
		curr->idom = NULL;
		curr->dominanceFrontier.clear();
		curr->dominanceChildren.clear();
	}

	// Get block predecessors and successors
	for(VmBlock *curr = firstBlock; curr; curr = curr->nextSibling)
	{
		for(unsigned i = 0; i < curr->users.size(); i++)
		{
			VmValue *user = curr->users[i];

			if(VmInstruction *inst = getType<VmInstruction>(user))
			{
				if(inst->cmd != VM_INST_PHI)
				{
					curr->predecessors.push_back(inst->parent);
					inst->parent->successors.push_back(curr);
				}
			}
		}
	}

	firstBlock->idom = firstBlock;

	SmallArray<VmBlock*, 32> blocksPostOrder(module->allocator);
	unsigned preOrder = 0;
	unsigned postOrder = 0;

	GetAndNumberControlGraphNodesDfs(blocksPostOrder, firstBlock, preOrder, postOrder);

	// Get nodes in reverse post order
	for(unsigned i = 0; i < blocksPostOrder.size() / 2; i++)
	{
		VmBlock *tmp = blocksPostOrder[i];
		blocksPostOrder[i] = blocksPostOrder[blocksPostOrder.size() - i - 1];
		blocksPostOrder[blocksPostOrder.size() - i - 1] = tmp;
	}

	bool changed = true;

	while(changed)
	{
		changed = false;

		for(unsigned i = 0; i < blocksPostOrder.size(); i++)
		{
			VmBlock *b = blocksPostOrder[i];

			if(b == firstBlock)
				continue;

			VmBlock *firstProcessed = NULL;

			for(unsigned k = 0; k < b->predecessors.size() && !firstProcessed; k++)
			{
				if(b->predecessors[k]->idom)
					firstProcessed = b->predecessors[k];
			}

			assert(firstProcessed);
			VmBlock *newIdom = firstProcessed;

			for(unsigned k = 0; k < b->predecessors.size(); k++)
			{
				VmBlock *p = b->predecessors[k];

				if(p == firstProcessed)
					continue;

				if(p->idom)
					newIdom = BlockIdomIntersect(p, newIdom);
			}

			if(b->idom != newIdom)
			{
				b->idom = newIdom;
				changed = true;
			}
		}
	}

	firstBlock->idom = NULL;

	// Fill the dominance frontier and dominator tree children
	for(VmBlock *curr = firstBlock; curr; curr = curr->nextSibling)
	{
		if(!curr->visited)
			continue;

		if(curr->predecessors.size() >= 2)
		{
			for(unsigned i = 0; i < curr->predecessors.size(); i++)
			{
				VmBlock *p = curr->predecessors[i];

				if(!p->visited)
					continue;

				VmBlock *runner = p;

				while(runner != curr->idom)
				{
					bool found = false;
					for(unsigned k = 0; k < runner->dominanceFrontier.size() && !found; k++)
					{
						if(runner->dominanceFrontier[k] == curr)
							found = true;
					}
					if(!found)
						runner->dominanceFrontier.push_back(curr);

					runner = runner->idom;
				}
			}
		}

		if(curr->idom)
			curr->idom->dominanceChildren.push_back(curr);
	}

	for(VmBlock *curr = firstBlock; curr; curr = curr->nextSibling)
		curr->visited = false;

	preOrder = 0;
	postOrder = 0;
	NumberDominanceGraphNodesDfs(firstBlock, preOrder, postOrder);
}